

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall icu_63::ZNames::ZNames(ZNames *this,UChar **names,UChar *locationName)

{
  UChar *locationName_local;
  UChar **names_local;
  ZNames *this_local;
  
  this->fDidAddIntoTrie = '\0';
  memcpy(this,names,0x38);
  if (locationName == (UChar *)0x0) {
    this->fOwnsLocationName = '\0';
  }
  else {
    this->fOwnsLocationName = '\x01';
    this->fNames[0] = locationName;
  }
  return;
}

Assistant:

ZNames(const UChar* names[], const UChar* locationName)
            : fDidAddIntoTrie(FALSE) {
        uprv_memcpy(fNames, names, sizeof(fNames));
        if (locationName != NULL) {
            fOwnsLocationName = TRUE;
            fNames[UTZNM_INDEX_EXEMPLAR_LOCATION] = locationName;
        } else {
            fOwnsLocationName = FALSE;
        }
    }